

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

double __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprCounter>_>
::ReadConstant(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprCounter>_>
               *this,char code)

{
  BinaryReader<mp::internal::IdentityConverter> *this_00;
  short sVar1;
  int iVar2;
  undefined7 in_register_00000031;
  double dVar3;
  
  this_00 = this->reader_;
  iVar2 = (int)CONCAT71(in_register_00000031,code);
  if (iVar2 == 0x6c) {
    iVar2 = BinaryReader<mp::internal::IdentityConverter>::ReadInt<int>(this_00);
  }
  else {
    if (iVar2 != 0x73) {
      if (iVar2 != 0x6e) {
        BinaryReaderBase::ReportError<>(&this_00->super_BinaryReaderBase,(CStringRef)0x12ced6);
        return 0.0;
      }
      dVar3 = BinaryReader<mp::internal::IdentityConverter>::ReadDouble(this_00);
      return dVar3;
    }
    sVar1 = BinaryReader<mp::internal::IdentityConverter>::ReadInt<short>(this_00);
    iVar2 = (int)sVar1;
  }
  return (double)iVar2;
}

Assistant:

double NLReader<Reader, Handler>::ReadConstant(char code) {
  double value = 0;
  switch (code) {
  case 'n':
    value = reader_.ReadDouble();
    break;
  case 's':
    value = reader_.template ReadInt<short>();
    break;
  case 'l':
    // The following check is necessary for compatibility with ASL.
    if (sizeof(double) == 2 * sizeof(int))
      value = reader_.template ReadInt<int>();
    else
      value = reader_.template ReadInt<long>();
    break;
  default:
    reader_.ReportError("expected constant");
  }
  reader_.ReadTillEndOfLine();
  return value;
}